

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_clamp(ggml_context *ctx,ggml_tensor *a,float min,float max)

{
  ggml_tensor *tensor;
  float params [2];
  
  tensor = ggml_view_tensor(ctx,a);
  params[0] = min;
  params[1] = max;
  ggml_set_op_params(tensor,params,8);
  tensor->op = GGML_OP_CLAMP;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_clamp(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 min,
        float                 max) {
    // TODO: when implement backward, fix this:
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    float params[] = { min, max };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CLAMP;
    result->src[0] = a;

    return result;
}